

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void unlink_all_msgsent_handles(Curl_multi *multi)

{
  void *p;
  Curl_easy *data;
  Curl_llist_node *e;
  Curl_multi *multi_local;
  
  for (data = (Curl_easy *)Curl_llist_head(&multi->msgsent); data != (Curl_easy *)0x0;
      data = (Curl_easy *)Curl_node_next((Curl_llist_node *)data)) {
    p = Curl_node_elem((Curl_llist_node *)data);
    if (p != (void *)0x0) {
      Curl_node_remove((Curl_llist_node *)((long)p + 0x20));
      Curl_llist_append(&multi->process,p,(Curl_llist_node *)((long)p + 0x20));
    }
  }
  return;
}

Assistant:

static void unlink_all_msgsent_handles(struct Curl_multi *multi)
{
  struct Curl_llist_node *e;
  for(e = Curl_llist_head(&multi->msgsent); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    if(data) {
      DEBUGASSERT(data->mstate == MSTATE_MSGSENT);
      Curl_node_remove(&data->multi_queue);
      /* put it into the process list */
      Curl_llist_append(&multi->process, data, &data->multi_queue);
    }
  }
}